

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

bool __thiscall crsGA::Logger::removeLogHandler(Logger *this,string *id)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  
  std::mutex::lock(&this->_mutex);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
               ::find(&(this->_logHandlersMap)._M_t,id);
  p_Var1 = &(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>>
                        *)&this->_logHandlersMap,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool Logger::removeLogHandler(const std::string &id)
{
    std::lock_guard<std::mutex> lock(_mutex);

    auto itr = _logHandlersMap.find(id);
    if (itr != _logHandlersMap.end())
    {
        _logHandlersMap.erase(itr);
        return true;
    }
    return false;
}